

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

bool __thiscall
Assimp::SMDImporter::ParseFloat(SMDImporter *this,char *szCurrent,char **szCurrentOut,float *out)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  
  do {
    uVar2 = (ulong)(byte)*szCurrent;
    if (0x20 < uVar2) {
LAB_00626e90:
      bVar3 = true;
LAB_00626e6f:
      if (bVar3 != false) {
        pcVar1 = fast_atoreal_move<float>((Assimp *)szCurrent,(char *)out,(float *)0x1,SUB81(out,0))
        ;
        *szCurrentOut = pcVar1;
      }
      return bVar3;
    }
    if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
        bVar3 = false;
        goto LAB_00626e6f;
      }
      goto LAB_00626e90;
    }
    szCurrent = (char *)((Assimp *)szCurrent + 1);
  } while( true );
}

Assistant:

bool SMDImporter::ParseFloat(const char* szCurrent, const char** szCurrentOut, float& out) {
    if(!SkipSpaces(&szCurrent)) {
        return false;
    }

    *szCurrentOut = fast_atoreal_move<float>(szCurrent,out);
    return true;
}